

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O3

string * __thiscall
QPDF::compute_encryption_key
          (string *__return_storage_ptr__,QPDF *this,string *password,EncryptionData *data)

{
  bool disregard;
  bool local_9;
  
  if (*(int *)&(password->_M_dataplus)._M_p < 5) {
    compute_encryption_key_from_password(__return_storage_ptr__,this,password,data);
  }
  else {
    recover_encryption_key_with_password
              (__return_storage_ptr__,(string *)this,(EncryptionData *)password,&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::compute_encryption_key(std::string const& password, EncryptionData const& data)
{
    if (data.getV() >= 5) {
        // For V >= 5, the encryption key is generated and stored in the file, encrypted separately
        // with both user and owner passwords.
        return recover_encryption_key_with_password(password, data);
    } else {
        // For V < 5, the encryption key is derived from the user
        // password.
        return compute_encryption_key_from_password(password, data);
    }
}